

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_proxy_revoke(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic,
                       JSValue *func_data)

{
  int iVar1;
  JSValue v;
  long lVar2;
  
  if (((int)func_data->tag == -1) && (*(short *)((long)(func_data->u).ptr + 6) == 0x29)) {
    lVar2 = *(long *)((long)(func_data->u).ptr + 0x30);
  }
  else {
    lVar2 = 0;
  }
  if (lVar2 != 0) {
    *(undefined1 *)(lVar2 + 0x21) = 1;
    v = *func_data;
    if ((0xfffffff4 < (uint)func_data->tag) &&
       (iVar1 = *(func_data->u).ptr, *(int *)(func_data->u).ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,v);
    }
    (func_data->u).int32 = 0;
    func_data->tag = 2;
  }
  return (JSValue)(ZEXT816(3) << 0x40);
}

Assistant:

static JSValue js_proxy_revoke(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv, int magic,
                               JSValue *func_data)
{
    JSProxyData *s = JS_GetOpaque(func_data[0], JS_CLASS_PROXY);
    if (s) {
        /* We do not free the handler and target in case they are
           referenced as constants in the C call stack */
        s->is_revoked = TRUE;
        JS_FreeValue(ctx, func_data[0]);
        func_data[0] = JS_NULL;
    }
    return JS_UNDEFINED;
}